

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
set_char(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
         *this,char_type ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,
        bool icase)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,icase) != 0) {
    basic_chset_8bit<char>::
    set<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ((basic_chset_8bit<char> *)this,ch,tr);
    return;
  }
  std::bitset<256UL>::set((bitset<256UL> *)this,(ulong)(byte)ch,true);
  return;
}

Assistant:

void set_char(char_type ch, Traits const &tr, bool icase)
    {
        icase ? this->base_type::set(ch, tr) : this->base_type::set(ch);
    }